

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::fragment_sections::fragment_sections
          (fragment_sections *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction
          ,not_null<const_string_mapping_*> names,not_null<const_index::digest_*> digest)

{
  transaction_base *this_00;
  database *pdVar1;
  context *this_01;
  database *pdVar2;
  fragment_sections *this_local;
  not_null<const_index::digest_*> digest_local;
  not_null<const_string_mapping_*> names_local;
  not_null<transaction_base_*> transaction_local;
  not_null<context_*> ctxt_local;
  
  names_local.ptr_ = (string_mapping *)transaction.ptr_;
  transaction_local.ptr_ = (transaction_base *)ctxt.ptr_;
  rule::rule(&this->super_rule,ctxt);
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__fragment_sections_003f79b0;
  (this->transaction_).ptr_ = (transaction_base *)names_local.ptr_;
  (this->names_).ptr_ = names.ptr_;
  (this->digest_).ptr_ = digest.ptr_;
  std::array<pstore::repo::section_content,_19UL>::array(&this->contents_);
  std::
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::vector(&this->linked_definitions_);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::vector(&this->dispatchers_);
  std::
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  ::back_insert_iterator(&this->oit_,&this->dispatchers_);
  this_00 = gsl::not_null<pstore::transaction_base_*>::operator->
                      ((not_null<pstore::transaction_base_*> *)&names_local);
  pdVar1 = transaction_base::db(this_00);
  this_01 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->
                      ((not_null<pstore::exchange::import_ns::context_*> *)&transaction_local);
  pdVar2 = gsl::not_null::operator_cast_to_database_((not_null *)this_01);
  if (pdVar1 == pdVar2) {
    return;
  }
  assert_failed("&transaction->db () == ctxt->db",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                ,0x6c);
}

Assistant:

fragment_sections::fragment_sections (not_null<context *> const ctxt,
                                                  not_null<transaction_base *> const transaction,
                                                  not_null<string_mapping const *> const names,
                                                  not_null<index::digest const *> const digest)
                    : rule (ctxt)
                    , transaction_{transaction}
                    , names_{names}
                    , digest_{digest}
                    , oit_{dispatchers_} {
                PSTORE_ASSERT (&transaction->db () == ctxt->db);
            }